

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void exception_handler(int sig)

{
  char *pcVar1;
  int quit_application;
  
  pcVar1 = strsignal(sig);
  quit_application = 0x139a45;
  cm_print_error("Test failed with exception: %s(%d)",pcVar1,sig);
  exit_test(quit_application);
}

Assistant:

static void exception_handler(int sig) {
    const char *sig_strerror = "";

#ifdef HAVE_STRSIGNAL
    sig_strerror = strsignal(sig);
#endif

    cm_print_error("Test failed with exception: %s(%d)",
                   sig_strerror, sig);
    exit_test(1);
}